

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void SpawnDeepSplash(AActor *t1,FTraceResults *trace,AActor *puff)

{
  sector_t *sec;
  AActor *local_40;
  TVector2<double> local_38;
  TVector3<double> *local_28;
  DVector3 *hitpos;
  AActor *puff_local;
  FTraceResults *trace_local;
  AActor *t1_local;
  
  if (trace->Crossed3DWater == (F3DFloor *)0x0) {
    if (trace->CrossedWater == (sector_t *)0x0) {
      return;
    }
    if (trace->CrossedWater->heightsec == (sector_t *)0x0) {
      return;
    }
    local_28 = &trace->CrossedWaterPos;
  }
  else {
    local_28 = &trace->Crossed3DWaterPos;
  }
  local_40 = t1;
  if (puff != (AActor *)0x0) {
    local_40 = puff;
  }
  hitpos = (DVector3 *)puff;
  puff_local = (AActor *)trace;
  trace_local = (FTraceResults *)t1;
  TVector2<double>::TVector2(&local_38,local_28);
  sec = P_PointInSector(&local_38);
  P_HitWater(local_40,sec,local_28,false,true,false);
  return;
}

Assistant:

static void SpawnDeepSplash(AActor *t1, const FTraceResults &trace, AActor *puff)
{
	const DVector3 *hitpos;
	if (trace.Crossed3DWater)
	{
		hitpos = &trace.Crossed3DWaterPos;
	}
	else if (trace.CrossedWater && trace.CrossedWater->heightsec)
	{
		hitpos = &trace.CrossedWaterPos;
	}
	else return;

	P_HitWater(puff != NULL ? puff : t1, P_PointInSector(*hitpos), *hitpos);
}